

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::StartListField
          (ProtoWriter *this,Field *field,Type *type)

{
  ProtoElement *pPVar1;
  ProtoElement *this_00;
  
  this_00 = (ProtoElement *)operator_new(0xa8);
  pPVar1 = (this->element_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
           ._M_head_impl;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
  _M_head_impl = (ProtoElement *)0x0;
  ProtoElement::ProtoElement(this_00,pPVar1,field,type,true);
  pPVar1 = (this->element_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
           ._M_head_impl;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
  _M_head_impl = this_00;
  if (pPVar1 != (ProtoElement *)0x0) {
    (**(code **)((long)(pPVar1->super_BaseElement)._vptr_BaseElement + 8))();
  }
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::StartListField(const google::protobuf::Field& field,
                                         const google::protobuf::Type& type) {
  element_.reset(new ProtoElement(element_.release(), &field, type, true));
  return this;
}